

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdevice.cpp
# Opt level: O0

void QInputDevicePrivate::registerDevice(QInputDevice *dev)

{
  long lVar1;
  bool bVar2;
  QDebug *o;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)4> qt_category;
  QMutexLocker<QBasicMutex> lock;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QDebug *in_stack_ffffffffffffffb8;
  QDebug local_40;
  QDebug local_38;
  QDebug local_30;
  QInputDevice *device;
  QDebug *debug;
  char *t;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(QBasicMutex *)in_RDI);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_deviceList>_> *)
             in_RDI);
  QList<const_QInputDevice_*>::append
            ((QList<const_QInputDevice_*> *)0x39c92b,(parameter_type)in_RDI);
  device = (QInputDevice *)&DAT_aaaaaaaaaaaaaaaa;
  debug = (QDebug *)&DAT_aaaaaaaaaaaaaaaa;
  QtPrivateLogging::lcQpaInputDevices();
  anon_unknown.dwarf_4edfe4::QLoggingCategoryMacroHolder<(QtMsgType)4>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  while( true ) {
    bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffd8);
    if (!bVar2) break;
    anon_unknown.dwarf_4edfe4::QLoggingCategoryMacroHolder<(QtMsgType)4>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)4> *)0x39c972);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
               (char *)in_RDI,(char *)0x39c988);
    QMessageLogger::info();
    o = QDebug::operator<<(in_stack_ffffffffffffffb8,t);
    QDebug::QDebug(&local_38,o);
    ::operator<<(debug,device);
    QDebug::~QDebug(&local_30);
    QDebug::~QDebug(&local_38);
    QDebug::~QDebug(&local_40);
    debug = (QDebug *)((ulong)debug & 0xffffffffffffff00);
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker
            ((QMutexLocker<QBasicMutex> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDevicePrivate::registerDevice(const QInputDevice *dev)
{
    QMutexLocker lock(&devicesMutex);
    deviceList()->append(dev);
    qCInfo(lcQpaInputDevices) << "Registered" << dev;
}